

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.cpp
# Opt level: O1

string * utf8_character_abi_cxx11_(string *__return_storage_ptr__,uint codepoint)

{
  ulong uVar1;
  ulong in_RAX;
  size_t sVar2;
  undefined1 uVar3;
  char sequence [5];
  undefined8 local_18;
  
  local_18 = in_RAX & 0xffffff0000000000;
  uVar3 = (undefined1)codepoint;
  if (codepoint < 0x80) {
    local_18 = CONCAT71(local_18._1_7_,uVar3);
  }
  else if (codepoint < 0x800) {
    local_18 = CONCAT62(local_18._2_6_,CONCAT11(uVar3,(char)(codepoint >> 6))) & 0xffffffffffff3fff
               | 0x80c0;
  }
  else if (codepoint < 0x10000) {
    uVar1 = CONCAT62(local_18._2_6_,CONCAT11((char)(codepoint >> 6),(char)(codepoint >> 0xc))) &
            0xffffffffffff3fff;
    local_18._3_5_ = (undefined5)(uVar1 >> 0x18);
    local_18 = CONCAT53(local_18._3_5_,CONCAT12(uVar3,(short)uVar1)) & 0xffffffffff3fffff | 0x8080e0
    ;
  }
  else if (codepoint < 0x110000) {
    uVar1 = CONCAT62(local_18._2_6_,CONCAT11((char)(codepoint >> 0xc),(char)(codepoint >> 0x12))) &
            0xffffffffffff3fff;
    local_18._3_5_ = (undefined5)(uVar1 >> 0x18);
    uVar1 = CONCAT53(local_18._3_5_,CONCAT12((char)(codepoint >> 6),(short)uVar1)) &
            0xffffffffff3fffff;
    local_18._4_4_ = (undefined4)(uVar1 >> 0x20);
    local_18 = CONCAT44(local_18._4_4_,CONCAT13(uVar3,(int3)uVar1)) & 0xffffffff3fffffff |
               0x808080f0;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar2 = strlen((char *)&local_18);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,&local_18,(long)&local_18 + sVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string utf8_character (unsigned int codepoint)
{
  char sequence[5] {};

  // 0xxxxxxx -> 0xxxxxxx
  if (codepoint < 0x80)
  {
    sequence[0] = codepoint;
  }

  // 00000yyy yyxxxxxx -> 110yyyyy 10xxxxxx
  else if (codepoint < 0x800)
  {
    sequence[0] = 0xC0 | (codepoint & 0x7C0) >> 6;
    sequence[1] = 0x80 | (codepoint & 0x3F);
  }

  // zzzzyyyy yyxxxxxx -> 1110zzzz 10yyyyyy 10xxxxxx
  else if (codepoint < 0x10000)
  {
    sequence[0] = 0xE0 | (codepoint & 0xF000) >> 12;
    sequence[1] = 0x80 | (codepoint & 0xFC0)  >> 6;
    sequence[2] = 0x80 | (codepoint & 0x3F);
  }

  // 000wwwzz zzzzyyyy yyxxxxxx -> 11110www 10zzzzzz 10yyyyyy 10xxxxxx
  else if (codepoint < 0x110000)
  {
    sequence[0] = 0xF0 | (codepoint & 0x1C0000) >> 18;
    sequence[1] = 0x80 | (codepoint & 0x03F000) >> 12;
    sequence[2] = 0x80 | (codepoint & 0x0FC0)   >> 6;
    sequence[3] = 0x80 | (codepoint & 0x3F);
  }

  return std::string (sequence);
}